

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O1

double __thiscall libDAI::TRW::run(TRW *this)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  _Self __tmp;
  ostream *poVar11;
  ostream *poVar12;
  mapped_type *pmVar13;
  undefined4 extraout_var;
  _Base_ptr p_Var14;
  long lVar15;
  ostream *poVar16;
  _Rb_tree_node_base *p_Var17;
  char *pcVar18;
  _Self __tmp_2;
  _Rb_tree_node_base *p_Var19;
  const_iterator pos;
  ostream *poVar20;
  undefined1 auVar21 [16];
  _Rb_tree_node_base *p_Var22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
  alpha_gain;
  WeightedGraph<double> cur_rho;
  key_type_conflict1 local_128;
  TRW *local_120;
  _Rb_tree_node_base *local_118;
  undefined8 uStack_110;
  _Rb_tree_node_base *local_108;
  _Rb_tree_node_base *local_100;
  double local_f8;
  ostream *local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  ostream *local_d0;
  double local_c8;
  WeightedGraph<double> *local_c0;
  _Base_ptr local_b8;
  undefined8 uStack_b0;
  _Rb_tree<double,_std::pair<const_double,_double>,_std::_Select1st<std::pair<const_double,_double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
  local_a8;
  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  local_78;
  double local_48;
  undefined8 uStack_40;
  
  if ((this->Props).verbose != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&local_78,this);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_78._M_impl._0_8_,
                         local_78._M_impl.super__Rb_tree_header._M_header._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"...",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((_Base_ptr *)local_78._M_impl._0_8_ !=
        &local_78._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_78._M_impl._0_8_,
                      (ulong)((long)&(local_78._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
  }
  (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xe])(this);
  p_Var22 = (_Rb_tree_node_base *)inner_loop(this);
  (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])(this);
  local_128 = 0.5;
  local_108 = p_Var22;
  local_100 = p_Var22;
  if ((this->Props).maxouteriter != 0) {
    local_c0 = &this->_rho_e;
    p_Var1 = &local_a8._M_impl.super__Rb_tree_header;
    poVar11 = (ostream *)0x0;
    local_120 = this;
    do {
      local_d8 = calc_rho_descent(this);
      if (1 < (this->Props).verbose) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        poVar12 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"iter = ",7);
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,", cur_logZ = ",0xd);
        poVar12 = std::ostream::_M_insert<double>((double)local_100);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,", weight = ",0xb);
        poVar12 = std::ostream::_M_insert<double>(local_d8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
      }
      local_d0 = poVar11;
      if (NAN(local_d8)) {
        if ((this->Props).verbose != 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          poVar11 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,
                     "Reached NAN! Not going further...you\'ll have to use the current result",0x46)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
        bVar6 = false;
        this = local_120;
        poVar12 = local_d0;
      }
      else {
        std::
        _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
        ::_Rb_tree(&local_78,
                   (_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                    *)local_c0);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        poVar16 = (ostream *)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        do {
          std::
          _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
          ::operator=((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                       *)local_c0,&local_78);
          if (2 < (this->Props).verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"checking alpha = ",0x11);
            poVar12 = std::ostream::_M_insert<double>(local_128);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"...",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
          }
          update_rho_e(this,local_128);
          p_Var22 = (_Rb_tree_node_base *)inner_loop(this);
          (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])(this);
          local_118 = (_Rb_tree_node_base *)((double)local_108 - (double)p_Var22);
          local_100 = p_Var22;
          if (2 < (this->Props).verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  for alpha = ",0xe);
            poVar12 = std::ostream::_M_insert<double>(local_128);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,", gain = ",9);
            poVar12 = std::ostream::_M_insert<double>((double)local_118);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12," >=? alpha * weight = ",0x16);
            poVar12 = std::ostream::_M_insert<double>(local_d8 * local_128);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,", gain / (alpha * weight) = ",0x1c);
            poVar12 = std::ostream::_M_insert<double>((double)local_118 / (local_d8 * local_128));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
          }
          poVar20 = poVar16;
          if (((ulong)poVar16 & 1) == 0) {
            pmVar13 = std::
                      map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                      ::operator[]((map<double,_double,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
                                    *)&local_a8,&local_128);
            *pmVar13 = (mapped_type)local_118;
            local_118 = &p_Var1->_M_header;
            local_f0 = poVar16;
            p_Var17 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var19 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
            for (p_Var22 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var22 != p_Var1;
                p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22)) {
              if (NAN((double)p_Var22[1]._M_parent)) {
                if ((_Rb_tree_header *)local_118 == p_Var1) {
                  local_118 = p_Var22;
                }
              }
              else {
                p_Var17 = p_Var22;
                if ((double)p_Var19[1]._M_parent < (double)p_Var22[1]._M_parent) {
                  p_Var19 = p_Var22;
                }
              }
            }
            iVar10 = (*(local_120->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm
                       [6])();
            p_Var14 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)local_a8._M_impl.super__Rb_tree_header._M_header._M_left !=
                p_Var1 && 2 < CONCAT44(extraout_var,iVar10)) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"      ",6)
                ;
                pcVar18 = " ";
                if (p_Var14 == p_Var19) {
                  pcVar18 = "*";
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,1);
                poVar11 = std::ostream::_M_insert<double>(*(double *)(p_Var14 + 1));
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                poVar11 = std::ostream::_M_insert<double>((double)p_Var14[1]._M_parent);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
              } while ((_Rb_tree_header *)p_Var14 != p_Var1);
            }
            if (p_Var19 == local_a8._M_impl.super__Rb_tree_header._M_header._M_left) {
              local_128 = *(key_type_conflict1 *)(p_Var19 + 1);
LAB_004db784:
              local_128 = local_128 * 0.5;
              poVar20 = (ostream *)((ulong)local_f0 & 0xffffffff);
              poVar16 = local_f0;
              this = local_120;
            }
            else {
              if (p_Var19 == p_Var17) {
                if ((_Rb_tree_header *)local_118 == p_Var1) {
                  local_128 = 1.0;
                }
                else {
                  local_128 = *(key_type_conflict1 *)(local_118 + 1);
                }
                local_128 = local_128 + *(double *)(p_Var19 + 1);
                goto LAB_004db784;
              }
              p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var19);
              local_e0 = *(double *)(p_Var22 + 1);
              local_b8 = p_Var22[1]._M_parent;
              uStack_b0 = 0;
              p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
              local_e8 = *(double *)(p_Var22 + 1);
              local_118 = p_Var22[1]._M_parent;
              uStack_110 = 0;
              lVar15 = std::_Rb_tree_increment(p_Var22);
              poVar16 = local_f0;
              this = local_120;
              local_c8 = *(double *)(lVar15 + 0x20);
              local_f8 = *(double *)(lVar15 + 0x28);
              local_48 = local_c8 - local_e0;
              uStack_40 = 0;
              dVar23 = local_e8;
              if ((((local_120->Props).tol <= local_48) && ((double)local_118 < (double)local_b8))
                 && ((double)local_118 < local_f8)) {
                if (2 < (local_120->Props).verbose) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"  fitting parabola through ",0x1b);
                  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 0xf;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"(x1,y1) = (",0xb);
                  poVar12 = std::ostream::_M_insert<double>(local_e0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
                  poVar12 = std::ostream::_M_insert<double>((double)local_b8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"), ",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"(x2,y2) = (",0xb);
                  poVar12 = std::ostream::_M_insert<double>(local_e8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
                  poVar12 = std::ostream::_M_insert<double>((double)local_118);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"), ",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"(x3,y3) = (",0xb);
                  poVar12 = std::ostream::_M_insert<double>(local_c8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
                  poVar12 = std::ostream::_M_insert<double>(local_f8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,").",2);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
                  std::ostream::put((char)poVar12);
                  std::ostream::flush();
                }
                auVar33._8_8_ = 0;
                auVar33._0_8_ = local_e0;
                auVar21._8_8_ = 0;
                auVar21._0_8_ = local_e0 * local_e0;
                auVar28._8_8_ = 0;
                auVar28._0_8_ = local_f8 - (double)local_118;
                auVar29._8_8_ = 0;
                auVar29._0_8_ = local_e8 * local_e8 * ((double)local_b8 - local_f8);
                auVar21 = vfmadd231sd_fma(auVar29,auVar28,auVar21);
                auVar32._8_8_ = 0;
                auVar32._0_8_ = local_c8;
                auVar24._8_8_ = 0;
                auVar24._0_8_ = local_c8 * local_c8;
                auVar31._8_8_ = 0;
                auVar31._0_8_ = (double)local_118 - (double)local_b8;
                auVar21 = vfmadd213sd_fma(auVar24,auVar31,auVar21);
                auVar30._8_8_ = 0;
                auVar30._0_8_ = local_e8 * ((double)local_b8 - local_f8);
                auVar24 = vfmadd231sd_fma(auVar30,auVar33,auVar28);
                auVar24 = vfmadd231sd_fma(auVar24,auVar32,auVar31);
                dVar23 = (auVar21._0_8_ * 0.5) / auVar24._0_8_;
              }
              poVar20 = (ostream *)CONCAT71((int7)((ulong)poVar11 >> 8),1);
              local_128 = dVar23;
              if (local_c8 < dVar23) {
                *(undefined8 *)(close + *(long *)(std::cerr + -0x18)) = 0xf;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"alpha = ",8);
                poVar11 = std::ostream::_M_insert<double>(local_128);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"(x1,y1) = (",0xb);
                poVar11 = std::ostream::_M_insert<double>(local_e0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
                poVar11 = std::ostream::_M_insert<double>((double)local_b8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"), ",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"(x2,y2) = (",0xb);
                poVar11 = std::ostream::_M_insert<double>(local_e8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
                poVar11 = std::ostream::_M_insert<double>((double)local_118);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"), ",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"(x3,y3) = (",0xb);
                poVar11 = std::ostream::_M_insert<double>(local_c8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
                poVar11 = std::ostream::_M_insert<double>(local_f8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,").",2);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                auVar7._8_8_ = uStack_110;
                auVar7._0_8_ = local_118;
                auVar25._8_8_ = 0;
                auVar25._0_8_ = (this->Props).tol;
                auVar9._8_8_ = uStack_40;
                auVar9._0_8_ = local_48;
                uVar2 = vcmppd_avx512vl(auVar25,auVar9,10);
                auVar8._8_8_ = uStack_b0;
                auVar8._0_8_ = local_b8;
                uVar3 = vcmppd_avx512vl(auVar7,auVar8,1);
                pcVar18 = "used alpha = x2";
                if ((double)local_118 < local_f8) {
                  pcVar18 = "fitted parabola";
                }
                if ((((byte)uVar2 & 3) & uVar3 & 1) == 0) {
                  pcVar18 = "used alpha = x2";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar18,0xf);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                std::ostream::put('X');
                std::ostream::flush();
              }
            }
            if (local_128 < (this->Props).tol) {
              local_128 = 0.0;
              std::
              _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
              ::operator=((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                           *)local_c0,&local_78);
              p_Var22 = (_Rb_tree_node_base *)inner_loop(local_120);
              this = local_120;
              (*(local_120->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xd])
                        (local_120);
              poVar16 = local_f0;
              local_100 = p_Var22;
            }
          }
          poVar12 = local_d0;
        } while ((((ulong)poVar16 & 1) == 0) &&
                (poVar16 = (ostream *)((ulong)poVar20 & 0xffffffff), poVar11 = poVar20,
                (this->Props).tol < local_128));
        if (2 < (this->Props).verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Accepted alpha = ",0x11);
          poVar11 = std::ostream::_M_insert<double>(local_128);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,", this gives improvement of logZ of ",0x24);
          poVar11 = std::ostream::_M_insert<double>((double)local_108 - (double)local_100);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
        auVar4._8_8_ = 0x7fffffffffffffff;
        auVar4._0_8_ = 0x7fffffffffffffff;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = (double)local_100 - (double)local_108;
        auVar21 = vandpd_avx512vl(auVar26,auVar4);
        dVar23 = (this->Props).outertol;
        bVar6 = dVar23 <= auVar21._0_8_;
        p_Var22 = local_100;
        if ((auVar21._0_8_ < dVar23) && (p_Var22 = local_108, (this->Props).verbose != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Reached tolerance! Ready!",0x19);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
          p_Var22 = local_108;
        }
        local_118 = p_Var22;
        std::
        _Rb_tree<double,_std::pair<const_double,_double>,_std::_Select1st<std::pair<const_double,_double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_double>_>_>
        ::~_Rb_tree(&local_a8);
        std::
        _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
        ::~_Rb_tree(&local_78);
        local_108 = local_118;
      }
    } while ((bVar6) && (poVar11 = poVar12 + 1, poVar11 < (ostream *)(this->Props).maxouteriter));
  }
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (double)local_100 - (double)local_108;
  auVar21 = vandpd_avx512vl(auVar27,auVar5);
  return auVar21._0_8_;
}

Assistant:

double TRW::run() {
        if( Props.verbose >= 1 )
            cout << "Starting " << identify() << "..." << endl;

        init();

        inner_loop();

        double prev_logZ = real(logZ());
        double cur_logZ = prev_logZ;
        double alpha = 0.5;
        for( size_t iter = 0; iter < Props.maxouteriter; iter++ ) {
            double weight = calc_rho_descent();
            // weight = - <nabla f, \tilde rho_e_descent>

            if( Props.verbose >= 2 )
                cout << endl << "iter = " << iter << ", cur_logZ = " << cur_logZ << ", weight = " << weight << endl;
            if( std::isnan( weight ) ) {
                if( Props.verbose >= 1 )
                    cout << endl << "Reached NAN! Not going further...you'll have to use the current result" << endl;
                break;  // don't proceed, as this will lead to even more nan's
            }

            WeightedGraph<double> cur_rho = _rho_e;
            map<double,double> alpha_gain;
            bool ready = false;
            do {
                _rho_e = cur_rho;
                if( Props.verbose >= 3 )
                    cout << "checking alpha = " << alpha << "..." << endl;
                update_rho_e(alpha); // rho_e = (1-alpha) cur_rho + alpha rho_descent

                // calculate everything at rho_e
                inner_loop();

                cur_logZ = real(logZ());
                double gain = prev_logZ - cur_logZ;  // should be positive
                if( Props.verbose >= 3 )
                    cout << "  for alpha = " << alpha << ", gain = " << gain << " >=? alpha * weight = " << alpha * weight << ", gain / (alpha * weight) = " << gain / (alpha * weight) << endl;

                if( ready )
                    break;

                alpha_gain[alpha] = gain;

                map<double,double>::const_iterator best = alpha_gain.begin();       // alpha with highest gain
                map<double,double>::const_iterator nan = alpha_gain.end();          // lowest alpha with gain==NAN
                map<double,double>::const_iterator last = alpha_gain.begin();       // highest alpha with gain!=NAN
                for( map<double,double>::const_iterator pos = alpha_gain.begin(); pos != alpha_gain.end(); pos++ ) {
                    if( std::isnan(pos->second) ) {
                        if( nan == alpha_gain.end() )
                            nan = pos;
                    } else {
                        last = pos;
                        if( pos->second > best->second )
                            best = pos;
                    }
                }
                if( Verbose() >= 3 )
                    for( map<double,double>::const_iterator pos = alpha_gain.begin(); pos != alpha_gain.end(); pos++ )
                        cout << "      " << ((pos == best) ? "*" : " ") << pos->first << " " << pos->second << endl;
                if( best == alpha_gain.begin() )
                    alpha = best->first / 2.0;
                else if( best == last ) {
                    if( nan == alpha_gain.end() )
                        alpha = (1.0 + best->first) / 2.0;
                    else
                        alpha = (nan->first + best->first) / 2.0;
                } else {
                    // fit a parabola through three points around best
                    best--; double x1 = best->first; double y1 = best->second;
                    best++; double x2 = best->first; double y2 = best->second;
                    best++; double x3 = best->first; double y3 = best->second;
                    assert( y1 <= y2 );
                    assert( y3 <= y2 );
                    if( (x3 - x1) < Props.tol || !((y2 < y1) && (y2 < y3)) )
                        alpha = x2;
                    else { // this is unstable if (x3-x1) becomes too small...
                        if( Props.verbose >= 3 ) {
                            cout << "  fitting parabola through ";
                            cout.precision( 15 );
                            cout << "(x1,y1) = (" << x1 << "," << y1 << "), ";
                            cout << "(x2,y2) = (" << x2 << "," << y2 << "), ";
                            cout << "(x3,y3) = (" << x3 << "," << y3 << ")." << endl;
                        }
                        alpha = 0.5 * (x1*x1*(y3-y2) + x2*x2*(y1-y3) + x3*x3*(y2-y1)) / (x1*(y3-y2) + x2*(y1-y3) + x3*(y2-y1));
                    }
                    assert( 0.0 < alpha );
                    assert( alpha < 1.0 );
                    assert( x1 <= alpha );
                    if( !(alpha <= x3) ) {
                        cerr.precision( 15 );
                        cerr << "alpha = " << alpha << endl;
                        cerr << "(x1,y1) = (" << x1 << "," << y1 << "), ";
                        cerr << "(x2,y2) = (" << x2 << "," << y2 << "), ";
                        cerr << "(x3,y3) = (" << x3 << "," << y3 << ")." << endl;
                        if( (x3 - x1) < Props.tol || !((y2 < y1) && (y2 < y3)) )
                            cerr << "used alpha = x2" << endl;
                        else
                            cerr << "fitted parabola" << endl;
                    }
                    assert( alpha <= x3 );
                    ready = true;
                }
                if( alpha < Props.tol ) {
                    alpha = 0.0;    // stay where you are in this case
                    _rho_e = cur_rho;
                    // calculate everything at rho_e
                    inner_loop();
                    cur_logZ = real(logZ());
                }
            } while( alpha > Props.tol ); 
            assert( !std::isnan(cur_logZ) );
            if( Props.verbose >= 3 ) {
                cout << "Accepted alpha = " << alpha << ", this gives improvement of logZ of " << prev_logZ - cur_logZ << endl;
            }

            if( fabs( cur_logZ - prev_logZ ) < Props.outertol )  {
                if( Props.verbose >= 1 )
                    cout << "Reached tolerance! Ready!" << endl;
                break; // reached tolerance
            }
            prev_logZ = cur_logZ;
        }

        assert( !std::isnan( cur_logZ ) );
        assert( !std::isnan( prev_logZ ) );
        return( fabs( cur_logZ - prev_logZ ) );
    }